

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetaEvent.cpp
# Opt level: O0

void __thiscall MIDI::MetaEvent::debug(MetaEvent *this)

{
  _Setbase _Var1;
  ostream *poVar2;
  MetaEvent *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\tInvalid Meta Event 0x");
  _Var1 = std::setbase(0x10);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->_metaType);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void MetaEvent::debug()
  { 
    cout << "\tInvalid Meta Event 0x" << setbase(16) << (unsigned int)_metaType << endl;
  }